

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map_test.cc
# Opt level: O2

void __thiscall
bloaty::RangeMapTest_UnknownSize3_Test::TestBody(RangeMapTest_UnknownSize3_Test *this)

{
  RangeMap *this_00;
  uint64_t uVar1;
  long lVar2;
  initializer_list<bloaty::RangeMapTest::Entry> __l;
  allocator_type local_a3;
  allocator<char> local_a2;
  allocator<char> local_a1;
  vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_> local_a0;
  undefined1 local_88 [24];
  string local_70 [32];
  undefined8 local_50;
  undefined8 local_48;
  uint64_t local_40;
  string local_38 [32];
  
  uVar1 = (this->super_RangeMapTest).kUnknownSize;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"foo",(allocator<char> *)&local_a0);
  this_00 = &(this->super_RangeMapTest).map_;
  RangeMap::AddRange(this_00,100,uVar1,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  uVar1 = (this->super_RangeMapTest).kUnknownSize;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"bar",(allocator<char> *)&local_a0);
  RangeMap::AddRange(this_00,0x96,uVar1,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"baz",(allocator<char> *)&local_a0);
  RangeMap::AddRange(this_00,100,100,(string *)local_88);
  std::__cxx11::string::~string((string *)local_88);
  local_88._0_8_ = (pointer)0x64;
  local_88._8_8_ = 0x96;
  local_88._16_8_ = (this->super_RangeMapTest).kNoTranslation;
  std::__cxx11::string::string<std::allocator<char>>(local_70,"foo",&local_a1);
  local_50 = 0x96;
  local_48 = 200;
  local_40 = (this->super_RangeMapTest).kNoTranslation;
  std::__cxx11::string::string<std::allocator<char>>(local_38,"bar",&local_a2);
  __l._M_len = 2;
  __l._M_array = (iterator)local_88;
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::vector
            (&local_a0,__l,&local_a3);
  RangeMapTest::AssertMainMapEquals(&this->super_RangeMapTest,&local_a0);
  std::vector<bloaty::RangeMapTest::Entry,_std::allocator<bloaty::RangeMapTest::Entry>_>::~vector
            (&local_a0);
  lVar2 = 0x50;
  do {
    std::__cxx11::string::~string((string *)(local_88 + lVar2));
    lVar2 = lVar2 + -0x38;
  } while (lVar2 != -0x20);
  return;
}

Assistant:

TEST_F(RangeMapTest, UnknownSize3) {
  map_.AddRange(100, kUnknownSize, "foo");
  map_.AddRange(150, kUnknownSize, "bar");
  // This tells us the ultimate size of "foo", and we keep the "foo" label even
  // though the new label is "baz".
  map_.AddRange(100, 100, "baz");
  AssertMainMapEquals({
    {100, 150, kNoTranslation, "foo"},
    {150, 200, kNoTranslation, "bar"},
  });
}